

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O0

void __thiscall
Am_Text_Viewing_Context_Data::Am_Text_Viewing_Context_Data
          (Am_Text_Viewing_Context_Data *this,Am_Text_Viewing_Context_Data *inProto)

{
  SLIBlock *this_00;
  Am_Text_Viewing_Context_Data *inProto_local;
  Am_Text_Viewing_Context_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_004112a0;
  Am_Rich_Text::Am_Rich_Text(&this->mText);
  this->mWidth = inProto->mWidth;
  Am_Rich_Text::operator=(&this->mText,&inProto->mText);
  this->mNumLines = 0;
  this_00 = (SLIBlock *)operator_new(0x188);
  SLIBlock::SLIBlock(this_00);
  this->mFirstLIBlock = this_00;
  (this->super_Am_Wrapper).field_0xc = 0;
  return;
}

Assistant:

Am_Text_Viewing_Context_Data::Am_Text_Viewing_Context_Data(
    Am_Text_Viewing_Context_Data *inProto)
{
  mWidth = inProto->mWidth;
  mText = inProto->mText;

  mNumLines = 0;
  mFirstLIBlock = new SLIBlock();
  mLIValid = false; // forces a call to Layout()
}